

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O1

void __thiscall
iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_single_char_Test<char16_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_single_char_Test<char16_t> *this)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_R9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> re;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> s;
  AssertionResult iutest_ar;
  allocator<char> local_231;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_230;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_210;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_210,L"dxle::sound_c LoadSoundMem",L"");
  local_198._0_2_ = 0x20;
  ::detail::
  operator|<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_char16_t,_char16_t,_nullptr>
            (&local_230,&local_210,
             (split_helper_subroutine<detail::split_at_first_back,_char16_t,_char16_t> *)local_198);
  local_198._0_8_ = L"LoadSoundMem";
  iutest::internal::CmpHelperEQ<char16_t_const*,std::__cxx11::u16string>
            (&local_1f0,(internal *)"constant::cpp_LoadSoundMem<char_type>()","re",local_198,
             (char16_t **)&local_230,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_231);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x58;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}